

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveAsciiDump.h
# Opt level: O2

void __thiscall
chrono::ChArchiveAsciiDump::out
          (ChArchiveAsciiDump *this,ChNameValue<chrono::ChEnumMapperBase> *bVal)

{
  ChStreamOutAscii *this_00;
  string mstr;
  string local_30 [32];
  
  indent(this);
  if (this->suppress_names == false) {
    this_00 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(this->ostream,*(char **)bVal)
    ;
    chrono::ChStreamOutAscii::operator<<(this_00,"\t");
  }
  chrono::ChStreamOutAscii::operator<<(this->ostream,"\"");
  (**(code **)(**(long **)(bVal + 8) + 0x10))(local_30);
  chrono::ChStreamOutAscii::operator<<(this->ostream,local_30);
  chrono::ChStreamOutAscii::operator<<(this->ostream,"\"\n");
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

virtual void out     (ChNameValue<ChEnumMapperBase> bVal) {
            indent();
            if (!suppress_names) 
                (*ostream) << bVal.name() << "\t";
            (*ostream) << "\"";
            std::string mstr = bVal.value().GetValueAsString();
            (*ostream) << mstr;
            (*ostream) << "\"\n";
      }